

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Accumulator.hpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
OpenMD::Utils::Accumulator<std::vector<double,_std::allocator<double>_>_>::getVariance
          (Accumulator<std::vector<double,_std::allocator<double>_>_> *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference pvVar6;
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  size_t i;
  vector<double,_std::allocator<double>_> *var;
  allocator_type *in_stack_ffffffffffffffa0;
  size_type sVar7;
  vector<double,_std::allocator<double>_> *__n;
  size_type local_30;
  
  __n = in_RDI;
  std::vector<double,_std::allocator<double>_>::size
            ((vector<double,_std::allocator<double>_> *)
             &in_RSI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  std::allocator<double>::allocator((allocator<double> *)0x3f34e7);
  std::vector<double,_std::allocator<double>_>::vector
            (in_RSI,(size_type)__n,in_stack_ffffffffffffffa0);
  std::allocator<double>::~allocator((allocator<double> *)0x3f3507);
  local_30 = 0;
  while (sVar7 = local_30,
        sVar4 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)
                           &in_RSI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish), sVar7 < sVar4) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RSI[3].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,local_30);
    dVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RSI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,local_30);
    dVar2 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RSI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,local_30);
    dVar3 = *pvVar5;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_30);
    *pvVar6 = -dVar2 * dVar3 + dVar1;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_30);
    if (*pvVar6 <= 0.0 && *pvVar6 != 0.0) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_30);
      *pvVar6 = 0.0;
    }
    local_30 = local_30 + 1;
  }
  return __n;
}

Assistant:

std::vector<RealType> getVariance() const {
      std::vector<RealType> var(Avg_.size());

      for (std::size_t i = 0; i < Avg_.size(); i++) {
        var[i] = (Avg2_[i] - Avg_[i] * Avg_[i]);
        if (var[i] < 0) var[i] = 0;
      }

      return var;
    }